

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_8x4_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  bool bVar10;
  int8_t *piVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000009;
  long lVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  undefined4 uVar17;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  undefined4 uVar41;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined4 uVar50;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i buf0 [8];
  __m128i buf1 [8];
  undefined8 auStack_148 [2];
  undefined8 local_138 [2];
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined1 local_118 [16];
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined1 local_f8 [16];
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined1 local_d8 [16];
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined8 local_b8 [5];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar18 [12];
  undefined1 auVar19 [16];
  undefined1 auVar23 [12];
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar34 [16];
  undefined1 auVar33 [16];
  undefined1 auVar29 [16];
  undefined1 auVar35 [16];
  undefined1 auVar30 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [12];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  
  piVar11 = av1_fwd_txfm_shift_ls[6];
  puVar16 = local_138;
  uVar13 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar10 = false;
  if (uVar13 < 0x10) {
    if ((0x4110U >> (uVar13 & 0x1f) & 1) != 0) {
LAB_004b9c40:
      lVar14 = 0x40;
      do {
        uVar5 = *(undefined8 *)(input + 4);
        *(undefined8 *)((long)auStack_148 + lVar14) = *(undefined8 *)input;
        *(undefined8 *)((long)auStack_148 + lVar14 + 8) = uVar5;
        input = input + stride;
        lVar14 = lVar14 + -0x10;
      } while (lVar14 != 0);
      goto LAB_004b9c5e;
    }
    if ((0x80a0U >> (uVar13 & 0x1f) & 1) == 0) {
      if (uVar13 == 6) {
        bVar10 = true;
        goto LAB_004b9c40;
      }
    }
    else {
      bVar10 = true;
    }
  }
  lVar14 = 0;
  do {
    uVar5 = *(undefined8 *)(input + 4);
    *(undefined8 *)((long)local_138 + lVar14) = *(undefined8 *)input;
    *(undefined8 *)((long)local_138 + lVar14 + 8) = uVar5;
    lVar14 = lVar14 + 0x10;
    input = input + stride;
  } while (lVar14 != 0x40);
LAB_004b9c5e:
  pcVar3 = *(code **)((long)col_txfm8x4_arr + (ulong)(uVar13 * 8));
  bVar2 = *av1_fwd_txfm_shift_ls[6];
  uVar12 = (uint)(char)bVar2;
  if ((int)uVar12 < 0) {
    auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    lVar14 = 0;
    do {
      auVar26 = paddsw(*(undefined1 (*) [16])((long)local_138 + lVar14),auVar24);
      auVar26 = psraw(auVar26,ZEXT416(-uVar12));
      *(undefined1 (*) [16])((long)local_138 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar14 = 0;
    do {
      auVar24 = psllw(*(undefined1 (*) [16])((long)local_138 + lVar14),ZEXT416(uVar12));
      *(undefined1 (*) [16])((long)local_138 + lVar14) = auVar24;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
  }
  pcVar4 = *(code **)((long)row_txfm4x8_arr + (ulong)(uVar13 * 8));
  auStack_148[1] = 0x4b9cf2;
  (*pcVar3)(local_138,local_138,0xd);
  bVar2 = piVar11[1];
  uVar13 = (uint)(char)bVar2;
  if ((int)uVar13 < 0) {
    auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar26._0_4_ = auVar24._0_4_;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    lVar14 = 0;
    do {
      auVar24 = paddsw(*(undefined1 (*) [16])((long)local_138 + lVar14),auVar26);
      auVar24 = psraw(auVar24,ZEXT416(-uVar13));
      *(undefined1 (*) [16])((long)local_138 + lVar14) = auVar24;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar14 = 0;
    do {
      auVar24 = psllw(*(undefined1 (*) [16])((long)local_138 + lVar14),ZEXT416(uVar13));
      *(undefined1 (*) [16])((long)local_138 + lVar14) = auVar24;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
  }
  auVar30._0_12_ = local_138._0_12_;
  auVar30._12_2_ = local_138[0]._6_2_;
  auVar30._14_2_ = uStack_122;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_10_ = local_138._0_10_;
  auVar29._10_2_ = uStack_124;
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_8_ = local_138[0];
  auVar28._8_2_ = local_138[0]._4_2_;
  auVar6._4_8_ = auVar28._8_8_;
  auVar6._2_2_ = uStack_126;
  auVar6._0_2_ = local_138[0]._2_2_;
  auVar27._0_4_ = CONCAT22(local_128,(short)local_138[0]);
  auVar27._4_12_ = auVar6;
  auVar48._0_12_ = local_118._0_12_;
  auVar48._12_2_ = local_118._6_2_;
  auVar48._14_2_ = uStack_102;
  auVar47._12_4_ = auVar48._12_4_;
  auVar47._0_10_ = local_118._0_10_;
  auVar47._10_2_ = uStack_104;
  auVar46._10_6_ = auVar47._10_6_;
  auVar46._0_8_ = local_118._0_8_;
  auVar46._8_2_ = local_118._4_2_;
  auVar7._4_8_ = auVar46._8_8_;
  auVar7._2_2_ = uStack_106;
  auVar7._0_2_ = local_118._2_2_;
  auVar40._0_12_ = local_f8._0_12_;
  auVar40._12_2_ = local_f8._6_2_;
  auVar40._14_2_ = uStack_e2;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = local_f8._0_10_;
  auVar39._10_2_ = uStack_e4;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = local_f8._0_8_;
  auVar38._8_2_ = local_f8._4_2_;
  auVar8._4_8_ = auVar38._8_8_;
  auVar8._2_2_ = uStack_e6;
  auVar8._0_2_ = local_f8._2_2_;
  auVar37._0_4_ = CONCAT22(local_e8,local_f8._0_2_);
  auVar37._4_12_ = auVar8;
  auVar56._0_12_ = local_d8._0_12_;
  auVar56._12_2_ = local_d8._6_2_;
  auVar56._14_2_ = uStack_c2;
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._0_10_ = local_d8._0_10_;
  auVar55._10_2_ = uStack_c4;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._0_8_ = local_d8._0_8_;
  auVar54._8_2_ = local_d8._4_2_;
  auVar9._4_8_ = auVar54._8_8_;
  auVar9._2_2_ = uStack_c6;
  auVar9._0_2_ = local_d8._2_2_;
  uVar17 = CONCAT22(uStack_120,(short)local_138[1]);
  auVar18._0_8_ = CONCAT26(uStack_11e,CONCAT24(local_138[1]._2_2_,uVar17));
  auVar18._8_2_ = local_138[1]._4_2_;
  auVar18._10_2_ = uStack_11c;
  auVar19._12_2_ = local_138[1]._6_2_;
  auVar19._0_12_ = auVar18;
  auVar19._14_2_ = uStack_11a;
  uVar41 = CONCAT22(uStack_100,local_118._8_2_);
  auVar42._0_8_ = CONCAT26(uStack_fe,CONCAT24(local_118._10_2_,uVar41));
  auVar42._8_2_ = local_118._12_2_;
  auVar42._10_2_ = uStack_fc;
  auVar43._12_2_ = local_118._14_2_;
  auVar43._0_12_ = auVar42;
  auVar43._14_2_ = uStack_fa;
  uVar22 = CONCAT22(uStack_e0,local_f8._8_2_);
  auVar23._0_8_ = CONCAT26(uStack_de,CONCAT24(local_f8._10_2_,uVar22));
  auVar23._8_2_ = local_f8._12_2_;
  auVar23._10_2_ = uStack_dc;
  auVar25._12_2_ = local_f8._14_2_;
  auVar25._0_12_ = auVar23;
  auVar25._14_2_ = uStack_da;
  uVar50 = CONCAT22(uStack_c0,local_d8._8_2_);
  auVar51._0_8_ = CONCAT26(uStack_be,CONCAT24(local_d8._10_2_,uVar50));
  auVar51._8_2_ = local_d8._12_2_;
  auVar51._10_2_ = uStack_bc;
  auVar52._12_2_ = local_d8._14_2_;
  auVar52._0_12_ = auVar51;
  auVar52._14_2_ = uStack_ba;
  auVar44._0_8_ = auVar27._0_8_;
  auVar44._8_4_ = auVar6._0_4_;
  auVar44._12_4_ = auVar7._0_4_;
  auVar45._0_8_ = auVar37._0_8_;
  auVar45._8_4_ = auVar8._0_4_;
  auVar45._12_4_ = auVar9._0_4_;
  auVar49._8_4_ = (int)((ulong)auVar18._0_8_ >> 0x20);
  auVar49._0_8_ = auVar18._0_8_;
  auVar49._12_4_ = (int)((ulong)auVar42._0_8_ >> 0x20);
  auVar53._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
  auVar53._0_8_ = auVar23._0_8_;
  auVar53._12_4_ = (int)((ulong)auVar51._0_8_ >> 0x20);
  auVar31._0_8_ = CONCAT44(auVar46._8_4_,auVar28._8_4_);
  auVar31._8_4_ = auVar29._12_4_;
  auVar31._12_4_ = auVar47._12_4_;
  auVar20._0_8_ = CONCAT44(auVar42._8_4_,auVar18._8_4_);
  auVar20._8_4_ = auVar19._12_4_;
  auVar20._12_4_ = auVar43._12_4_;
  local_b8[0] = CONCAT44(CONCAT22(local_108,local_118._0_2_),auVar27._0_4_);
  local_b8[1] = CONCAT44(CONCAT22(local_c8,local_d8._0_2_),auVar37._0_4_);
  local_b8[2] = auVar44._8_8_;
  local_b8[3] = auVar45._8_8_;
  local_b8[4] = auVar31._0_8_;
  uStack_90 = auVar38._8_4_;
  uStack_8c = auVar54._8_4_;
  local_88 = auVar31._8_8_;
  local_78 = CONCAT44(uVar41,uVar17);
  uStack_70 = CONCAT44(uVar50,uVar22);
  local_68 = auVar49._8_8_;
  uStack_60 = auVar53._8_8_;
  local_58 = auVar20._0_8_;
  uStack_50 = auVar23._8_4_;
  uStack_4c = auVar51._8_4_;
  local_48 = auVar20._8_8_;
  uStack_38 = auVar25._12_4_;
  uStack_34 = auVar52._12_4_;
  if (bVar10) {
    lVar14 = 0x80;
    puVar15 = local_b8;
    do {
      uVar5 = puVar15[1];
      *(undefined8 *)((long)auStack_148 + lVar14) = *puVar15;
      *(undefined8 *)((long)auStack_148 + lVar14 + 8) = uVar5;
      puVar15 = puVar15 + 2;
      lVar14 = lVar14 + -0x10;
    } while (lVar14 != 0);
  }
  else {
    puVar16 = local_b8;
  }
  auStack_148[1] = 0x4b9eb5;
  (*pcVar4)(puVar16,puVar16,0xd);
  auVar24 = _DAT_005690c0;
  bVar2 = piVar11[2];
  if ((char)bVar2 < '\0') {
    auVar26 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar26 = pshuflw(auVar26,auVar26,0);
    auVar21._0_4_ = auVar26._0_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    lVar14 = 0;
    do {
      auVar26 = paddsw(*(undefined1 (*) [16])((long)puVar16 + lVar14),auVar21);
      auVar26 = psraw(auVar26,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar16 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x80);
  }
  else if (bVar2 != 0) {
    lVar14 = 0;
    do {
      auVar26 = psllw(*(undefined1 (*) [16])((long)puVar16 + lVar14),ZEXT416((uint)(int)(char)bVar2)
                     );
      *(undefined1 (*) [16])((long)puVar16 + lVar14) = auVar26;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x80);
  }
  lVar14 = 0;
  do {
    auVar26 = *(undefined1 (*) [16])((long)puVar16 + lVar14);
    auVar36._0_12_ = auVar26._0_12_;
    auVar36._12_2_ = auVar26._6_2_;
    auVar36._14_2_ = 1;
    auVar35._12_4_ = auVar36._12_4_;
    auVar35._0_10_ = auVar26._0_10_;
    auVar35._10_2_ = 1;
    auVar34._10_6_ = auVar35._10_6_;
    auVar34._0_8_ = auVar26._0_8_;
    auVar34._8_2_ = auVar26._4_2_;
    auVar33._8_8_ = auVar34._8_8_;
    auVar33._0_8_ = 0x1000000000000;
    auVar32._6_10_ = auVar33._6_10_;
    auVar32._4_2_ = auVar26._2_2_;
    auVar32._0_2_ = auVar26._0_2_;
    auVar32._2_2_ = 1;
    auVar26 = pmaddwd(auVar32,auVar24);
    piVar1 = (int *)((long)output + lVar14);
    *piVar1 = auVar26._0_4_ >> 0xc;
    piVar1[1] = auVar26._4_4_ >> 0xc;
    piVar1[2] = auVar26._8_4_ >> 0xc;
    piVar1[3] = auVar26._12_4_ >> 0xc;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x80);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x4_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X4];
  const int txw_idx = get_txw_idx(TX_8X4);
  const int txh_idx = get_txh_idx(TX_8X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm8x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm4x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip)
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  else
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w4(buf, output, height, width);
}